

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86.cpp
# Opt level: O1

int __thiscall ncnn::LRN_x86::forward_inplace(LRN_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  size_t _elemsize;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  LRN_x86 *pLVar6;
  pointer piVar7;
  int iVar8;
  void *pvVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  void *pvVar14;
  uint uVar15;
  int iVar16;
  Mat *pMVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  Mat *pMVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  ulong local_188;
  allocator_type local_179;
  Mat local_178;
  ulong local_128;
  Mat *local_120;
  Mat *local_118;
  Mat *local_110;
  long local_108;
  void *local_100;
  long local_f8;
  LRN_x86 *local_f0;
  Mat local_e8;
  long local_98;
  void *local_90;
  long local_88;
  void *local_80;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar22 = bottom_top_blob->w;
  local_128 = (ulong)(uint)bottom_top_blob->h;
  uVar15 = bottom_top_blob->c;
  pMVar21 = (Mat *)(ulong)uVar15;
  _elemsize = bottom_top_blob->elemsize;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  Mat::create(&local_e8,uVar22,bottom_top_blob->h,uVar15,_elemsize,opt->workspace_allocator);
  iVar20 = -100;
  if ((local_e8.data == (void *)0x0) || ((long)local_e8.c * local_e8.cstep == 0)) goto LAB_0032f2c8;
  iVar20 = (int)local_128 * uVar22;
  if (0 < (int)uVar15) {
    pvVar9 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->cstep;
    sVar4 = bottom_top_blob->elemsize;
    pMVar17 = (Mat *)0x0;
    pvVar14 = local_e8.data;
    do {
      if (0 < iVar20) {
        lVar19 = 0;
        do {
          fVar1 = *(float *)((long)pvVar9 + lVar19 * 4);
          *(float *)((long)pvVar14 + lVar19 * 4) = fVar1 * fVar1;
          lVar19 = lVar19 + 1;
        } while (iVar20 != (int)lVar19);
      }
      pMVar17 = (Mat *)((long)&pMVar17->data + 1);
      pvVar9 = (void *)((long)pvVar9 + sVar3 * sVar4);
      pvVar14 = (void *)((long)pvVar14 +
                        local_e8.cstep *
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
    } while (pMVar17 != pMVar21);
  }
  iVar2 = (this->super_LRN).region_type;
  local_f0 = this;
  if (iVar2 == 0) {
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    Mat::create(&local_178,uVar22,(int)local_128,uVar15,_elemsize,opt->workspace_allocator);
    bVar24 = (long)local_178.c * local_178.cstep == 0;
    if (local_178.data == (void *)0x0 || bVar24) {
      piVar5 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            if (local_178.data != (void *)0x0) {
              free(local_178.data);
            }
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar20 = -100;
      local_178.cstep = 0;
      local_178.data = (void *)0x0;
      local_178.refcount._0_4_ = 0;
      local_178.refcount._4_4_ = 0;
      local_178.elemsize._0_4_ = 0;
      local_178.elemsize._4_4_ = 0;
      local_178.elempack = 0;
      local_178.dims = 0;
      local_178.w = 0;
      local_178.h = 0;
      local_178.d = 0;
      local_178.c = 0;
      goto LAB_0032f2c8;
    }
    local_120 = (Mat *)CONCAT71(local_120._1_7_,local_178.data == (void *)0x0 || bVar24);
    if (0 < local_178.c * (int)local_178.cstep) {
      memset(local_178.data,0,(ulong)(uint)(local_178.c * (int)local_178.cstep) << 2);
    }
    if (0 < (int)uVar15) {
      fVar1 = (local_f0->super_LRN).alpha;
      iVar2 = (local_f0->super_LRN).local_size;
      uVar22 = iVar2 / 2;
      local_128 = (ulong)-uVar22;
      pvVar9 = bottom_top_blob->data;
      local_108 = (long)(int)uVar22;
      local_100 = (void *)(local_178.cstep *
                          CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize));
      local_f8 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      pMVar17 = (Mat *)0x0;
      pvVar14 = local_178.data;
      local_110 = pMVar21;
      do {
        pLVar6 = local_f0;
        uVar15 = (int)local_128 + (int)pMVar17;
        if ((long)(int)uVar15 <= (long)((long)&pMVar17->data + local_108)) {
          lVar19 = local_178.cstep *
                   CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize) * (long)pMVar17
          ;
          do {
            if (uVar15 < (uint)local_110 && 0 < iVar20) {
              lVar18 = 0;
              do {
                *(float *)((long)local_178.data + lVar18 * 4 + lVar19) =
                     *(float *)((long)local_178.data + lVar18 * 4 + lVar19) +
                     *(float *)((long)local_e8.data +
                               lVar18 * 4 +
                               (ulong)uVar15 *
                               local_e8.cstep *
                               CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
                lVar18 = lVar18 + 1;
              } while (iVar20 != (int)lVar18);
            }
            bVar24 = uVar15 != uVar22;
            uVar15 = uVar15 + 1;
          } while (bVar24);
        }
        local_118 = pMVar17;
        if (0 < iVar20) {
          lVar19 = 0;
          do {
            fVar25 = powf(*(float *)((long)pvVar14 + lVar19 * 4) * fVar1 * (1.0 / (float)iVar2) +
                          (pLVar6->super_LRN).bias,-(pLVar6->super_LRN).beta);
            *(float *)((long)pvVar9 + lVar19 * 4) = fVar25 * *(float *)((long)pvVar9 + lVar19 * 4);
            lVar19 = lVar19 + 1;
          } while (iVar20 != (int)lVar19);
        }
        uVar22 = uVar22 + 1;
        pMVar17 = (Mat *)((long)&local_118->data + 1);
        pvVar14 = (void *)((long)pvVar14 + (long)local_100);
        pvVar9 = (void *)((long)pvVar9 + local_f8);
      } while (pMVar17 != local_110);
    }
    piVar5 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar20 = -100;
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    if ((char)local_120 != '\0') goto LAB_0032f2c8;
  }
  else if (iVar2 == 1) {
    piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    local_178.data = local_e8.data;
    local_178.refcount._0_4_ = local_e8.refcount._0_4_;
    local_178.refcount._4_4_ = local_e8.refcount._4_4_;
    local_178.elemsize._0_4_ = (undefined4)local_e8.elemsize;
    local_178.elemsize._4_4_ = local_e8.elemsize._4_4_;
    local_178.elempack = local_e8.elempack;
    local_178.allocator = local_e8.allocator;
    local_178.dims = local_e8.dims;
    local_178.w = local_e8.w;
    local_178.h = local_e8.h;
    local_178.d = local_e8.d;
    local_178.c = local_e8.c;
    local_178.cstep = local_e8.cstep;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    uVar15 = (this->super_LRN).local_size;
    uVar12 = uVar22;
    local_118 = bottom_top_blob;
    if (1 < (int)uVar15) {
      uVar12 = uVar15 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(&local_e8,&local_178,uVar12,~uVar12 + uVar15,uVar12,~uVar12 + uVar15,0,0.0,
                       (Option *)&_space_ofs);
      uVar12 = local_178.w;
      if (local_178.data == (void *)0x0 || (long)local_178.c * local_178.cstep == 0) {
        piVar5 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_178.allocator == (Allocator *)0x0) {
              if (local_178.data != (void *)0x0) {
                free(local_178.data);
              }
            }
            else {
              (*(local_178.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar20 = -100;
        local_178.cstep = 0;
        local_178.data = (void *)0x0;
        local_178.refcount._0_4_ = 0;
        local_178.refcount._4_4_ = 0;
        local_178.elemsize._0_4_ = 0;
        local_178.elemsize._4_4_ = 0;
        local_178.elempack = 0;
        local_178.dims = 0;
        local_178.w = 0;
        local_178.h = 0;
        local_178.d = 0;
        local_178.c = 0;
        goto LAB_0032f2c8;
      }
    }
    iVar20 = (this->super_LRN).local_size;
    uVar15 = iVar20 * iVar20;
    fVar1 = (this->super_LRN).alpha;
    local_110 = pMVar21;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar15,&local_179);
    piVar7 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = (this->super_LRN).local_size;
    if (0 < iVar2) {
      iVar8 = 0;
      iVar10 = 0;
      iVar13 = 0;
      do {
        if (0 < (this->super_LRN).local_size) {
          lVar19 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar13 + lVar19] = iVar10 + (int)lVar19;
            lVar19 = lVar19 + 1;
            iVar16 = (int)lVar19;
          } while (iVar16 < (this->super_LRN).local_size);
          iVar13 = iVar13 + iVar16;
          iVar10 = iVar10 + iVar16;
        }
        iVar10 = iVar10 + (uVar12 - iVar2);
        iVar8 = iVar8 + 1;
      } while (iVar8 < (this->super_LRN).local_size);
    }
    if (0 < (int)local_110) {
      local_f8 = (long)(int)uVar22;
      local_80 = local_118->data;
      local_88 = local_118->cstep * local_118->elemsize;
      local_90 = local_178.data;
      local_98 = local_178.cstep * CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize)
      ;
      local_108 = (long)local_178.w *
                  CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
      local_118 = (Mat *)CONCAT44(local_118._4_4_,1.0 / (float)(int)uVar15);
      local_120 = (Mat *)0x0;
      do {
        if (0 < (int)local_128) {
          local_100 = (void *)(local_98 * (long)local_120 + (long)local_90);
          pvVar9 = (void *)(local_88 * (long)local_120 + (long)local_80);
          local_188 = 0;
          do {
            pvVar14 = local_100;
            if (0 < (int)uVar22) {
              lVar19 = local_108 * local_188;
              uVar23 = 0;
              do {
                if (iVar20 == 0) {
                  fVar25 = 0.0;
                }
                else {
                  fVar25 = 0.0;
                  uVar11 = 0;
                  do {
                    fVar25 = fVar25 + *(float *)((long)pvVar14 +
                                                (long)piVar7[uVar11] * 4 + uVar23 * 4 + lVar19);
                    uVar11 = uVar11 + 1;
                  } while (uVar15 + (uVar15 == 0) != uVar11);
                }
                fVar25 = powf(fVar25 * fVar1 * local_118._0_4_ + (local_f0->super_LRN).bias,
                              -(local_f0->super_LRN).beta);
                *(float *)((long)pvVar9 + uVar23 * 4) =
                     fVar25 * *(float *)((long)pvVar9 + uVar23 * 4);
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar22);
            }
            pvVar9 = (void *)((long)pvVar9 + local_f8 * 4);
            local_188 = local_188 + 1;
          } while (local_188 != local_128);
        }
        local_120 = (Mat *)((long)&local_120->data + 1);
      } while (local_120 != local_110);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar5 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
  }
  iVar20 = 0;
LAB_0032f2c8:
  piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar20;
}

Assistant:

int LRN_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}